

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O3

Error __thiscall
asmjit::BaseAssembler::embedLabelDelta(BaseAssembler *this,Label *label,Label *base,size_t dataSize)

{
  uint uVar1;
  uint uVar2;
  CodeHolder *pCVar3;
  long lVar4;
  Logger *pLVar5;
  uint8_t *puVar6;
  Section *pSVar7;
  long lVar8;
  Error EVar9;
  U v;
  ulong uVar10;
  uint8_t *puVar11;
  ulong uVar12;
  undefined8 uVar13;
  long lVar14;
  undefined8 uVar15;
  char cVar16;
  ulong uVar17;
  uint8_t *__s;
  StringTmp<256UL> sb;
  anon_union_32_4_a21e1b61_for_String_0 local_158;
  char local_138 [264];
  
  pCVar3 = (this->super_BaseEmitter)._code;
  if (pCVar3 == (CodeHolder *)0x0) {
    EVar9 = 5;
LAB_00111934:
    EVar9 = BaseEmitter::reportError(&this->super_BaseEmitter,EVar9,(char *)0x0);
    return EVar9;
  }
  uVar1 = (label->super_Operand).super_Operand_._baseId;
  uVar2 = (pCVar3->_labelEntries).super_ZoneVectorBase._size;
  if (uVar1 < uVar2) {
    lVar14 = *(long *)((long)(pCVar3->_labelEntries).super_ZoneVectorBase._data + (ulong)uVar1 * 8);
  }
  else {
    lVar14 = 0;
  }
  uVar1 = (base->super_Operand).super_Operand_._baseId;
  if (((uVar2 <= uVar1) || (lVar14 == 0)) ||
     (lVar4 = *(long *)((long)(pCVar3->_labelEntries).super_ZoneVectorBase._data + (ulong)uVar1 * 8)
     , lVar4 == 0)) {
    EVar9 = 0xc;
    goto LAB_00111934;
  }
  uVar17 = (ulong)(((this->super_BaseEmitter)._environment._arch & 1) == 0) * 4 + 4;
  if (dataSize != 0) {
    uVar17 = dataSize;
  }
  if ((8 < uVar17) ||
     (uVar10 = uVar17 - (uVar17 >> 1 & 0x5555555555555555),
     uVar10 = (uVar10 >> 2 & 0x3333333333333333) + (uVar10 & 0x3333333333333333),
     1 < (byte)(((uVar10 >> 4) + uVar10 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38))) {
    EVar9 = 0x34;
    goto LAB_00111934;
  }
  __s = this->_bufferPtr;
  if ((ulong)((long)this->_bufferEnd - (long)__s) < uVar17) {
    EVar9 = CodeHolder::growBuffer(pCVar3,&this->_section->_buffer,uVar17);
    if (EVar9 == 0) {
      __s = this->_bufferPtr;
    }
    else {
      EVar9 = BaseEmitter::reportError(&this->super_BaseEmitter,EVar9,(char *)0x0);
      if (EVar9 != 0) {
        return EVar9;
      }
    }
  }
  if ((this->super_BaseEmitter)._logger != (Logger *)0x0) {
    local_158._large.data = local_138;
    local_158._large.size = 0;
    local_158._0_8_ = 0x20;
    local_158._large.capacity = 0x107;
    local_138[0] = '\0';
    lVar8 = 0;
    if (uVar17 != 0) {
      for (; (uVar17 >> lVar8 & 1) == 0; lVar8 = lVar8 + 1) {
      }
    }
    String::_opFormat((String *)&local_158._small,1,".%s (",dataSizeByPowerTable + lVar8 * 4);
    Formatter::formatLabel
              ((String *)&local_158._small,0,&this->super_BaseEmitter,
               (label->super_Operand).super_Operand_._baseId);
    String::_opString((String *)&local_158._small,1," - ",0xffffffffffffffff);
    Formatter::formatLabel
              ((String *)&local_158._small,0,&this->super_BaseEmitter,
               (base->super_Operand).super_Operand_._baseId);
    String::_opString((String *)&local_158._small,1,")\n",0xffffffffffffffff);
    pLVar5 = (this->super_BaseEmitter)._logger;
    uVar13 = local_158._large.size;
    uVar15 = local_158._large.data;
    if ((local_158._0_8_ & 0xff) < 0x1f) {
      uVar13 = local_158._0_8_ & 0xff;
      uVar15 = local_158._small.data;
    }
    (*pLVar5->_vptr_Logger[2])(pLVar5,uVar15,uVar13);
    String::reset((String *)&local_158._small);
  }
  if ((*(long *)(lVar14 + 0x20) == 0) || (*(long *)(lVar14 + 0x20) != *(long *)(lVar4 + 0x20))) {
    EVar9 = CodeHolder::newRelocEntry((this->super_BaseEmitter)._code,(RelocEntry **)&local_158,1);
    if (EVar9 != 0) goto LAB_00111ae4;
    pCVar3 = (this->super_BaseEmitter)._code;
    puVar6 = (pCVar3->_zone)._end;
    puVar11 = (uint8_t *)((ulong)((pCVar3->_zone)._ptr + 7) & 0xfffffffffffffff8);
    if (puVar11 < puVar6 && 0x17 < (ulong)((long)puVar6 - (long)puVar11)) {
      (pCVar3->_zone)._ptr = puVar11 + 0x18;
    }
    else {
      puVar11 = (uint8_t *)Zone::_alloc(&pCVar3->_zone,0x18,8);
    }
    if (puVar11 != (uint8_t *)0x0) {
      puVar11[0] = '\0';
      puVar11[1] = '\0';
      puVar11[2] = '\0';
      puVar11[3] = '\0';
      puVar11[4] = '\0';
      puVar11[5] = '\0';
      puVar11[6] = '\0';
      puVar11[7] = '\0';
      puVar11[0] = '\x01';
      puVar11[1] = '\x02';
      *(long *)(puVar11 + 8) = lVar14;
      puVar11[2] = '\x02';
      *(long *)(puVar11 + 0x10) = lVar4;
      *(undefined2 *)(local_158._0_8_ + 8) = 0;
      cVar16 = (char)uVar17;
      *(char *)(local_158._0_8_ + 10) = cVar16;
      *(char *)(local_158._0_8_ + 0xb) = cVar16;
      *(undefined1 *)(local_158._0_8_ + 0xc) = 0;
      *(char *)(local_158._0_8_ + 0xd) = cVar16 * '\b';
      *(undefined2 *)(local_158._0_8_ + 0xe) = 0;
      *(uint32_t *)(local_158._0_8_ + 0x10) = this->_section->_id;
      *(long *)(local_158._0_8_ + 0x18) = (long)this->_bufferPtr - (long)this->_bufferData;
      *(uint8_t **)(local_158._0_8_ + 0x20) = puVar11;
      memset(__s,0,uVar17);
      goto LAB_00111a68;
    }
  }
  else {
    uVar10 = *(long *)(lVar14 + 0x18) - *(long *)(lVar4 + 0x18);
    uVar12 = 0;
    do {
      __s[uVar12] = (uint8_t)uVar10;
      uVar10 = uVar10 >> 8;
      uVar12 = uVar12 + 1;
    } while (uVar17 != uVar12);
LAB_00111a68:
    pSVar7 = this->_section;
    uVar10 = (long)(__s + uVar17) - (long)this->_bufferData;
    if (uVar10 <= (pSVar7->_buffer)._capacity) {
      this->_bufferPtr = __s + uVar17;
      uVar17 = (pSVar7->_buffer)._size;
      if (uVar10 < uVar17) {
        uVar10 = uVar17;
      }
      (pSVar7->_buffer)._size = uVar10;
      return 0;
    }
    embedLabelDelta();
  }
  EVar9 = 1;
LAB_00111ae4:
  EVar9 = BaseEmitter::reportError(&this->super_BaseEmitter,EVar9,(char *)0x0);
  return EVar9;
}

Assistant:

Error BaseAssembler::embedLabelDelta(const Label& label, const Label& base, size_t dataSize) {
  if (ASMJIT_UNLIKELY(!_code))
    return reportError(DebugUtils::errored(kErrorNotInitialized));

  LabelEntry* labelEntry = _code->labelEntry(label);
  LabelEntry* baseEntry = _code->labelEntry(base);

  if (ASMJIT_UNLIKELY(!labelEntry || !baseEntry))
    return reportError(DebugUtils::errored(kErrorInvalidLabel));

  if (dataSize == 0)
    dataSize = registerSize();

  if (ASMJIT_UNLIKELY(!Support::isPowerOf2(dataSize) || dataSize > 8))
    return reportError(DebugUtils::errored(kErrorInvalidOperandSize));

  CodeWriter writer(this);
  ASMJIT_PROPAGATE(writer.ensureSpace(this, dataSize));

#ifndef ASMJIT_NO_LOGGING
  if (_logger) {
    StringTmp<256> sb;
    sb.appendFormat(".%s (", dataSizeByPowerTable[Support::ctz(dataSize)].str);
    Formatter::formatLabel(sb, 0, this, label.id());
    sb.append(" - ");
    Formatter::formatLabel(sb, 0, this, base.id());
    sb.append(")\n");
    _logger->log(sb);
  }
#endif

  // If both labels are bound within the same section it means the delta can be calculated now.
  if (labelEntry->isBound() && baseEntry->isBound() && labelEntry->section() == baseEntry->section()) {
    uint64_t delta = labelEntry->offset() - baseEntry->offset();
    writer.emitValueLE(delta, dataSize);
  }
  else {
    RelocEntry* re;
    Error err = _code->newRelocEntry(&re, RelocEntry::kTypeExpression);
    if (ASMJIT_UNLIKELY(err))
      return reportError(err);

    Expression* exp = _code->_zone.newT<Expression>();
    if (ASMJIT_UNLIKELY(!exp))
      return reportError(DebugUtils::errored(kErrorOutOfMemory));

    exp->reset();
    exp->opType = Expression::kOpSub;
    exp->setValueAsLabel(0, labelEntry);
    exp->setValueAsLabel(1, baseEntry);

    re->_format.resetToDataValue(dataSize);
    re->_sourceSectionId = _section->id();
    re->_sourceOffset = offset();
    re->_payload = (uint64_t)(uintptr_t)exp;

    writer.emitZeros(dataSize);
  }

  writer.done(this);
  return kErrorOk;
}